

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qfileinfogatherer_p.cpp
# Opt level: O0

void QFileInfoGatherer::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  QString *_t1;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  QFileInfoGatherer *in_RDI;
  QFileInfoGatherer *_t;
  QFileInfoGatherer *in_stack_ffffffffffffffa0;
  QFileInfoGatherer *in_stack_ffffffffffffffa8;
  QString *in_stack_ffffffffffffffb0;
  QFileInfoGatherer *in_stack_ffffffffffffffb8;
  QFileInfoGatherer *in_stack_ffffffffffffffc0;
  QStringList *in_stack_ffffffffffffffc8;
  QFileInfoGatherer *in_stack_ffffffffffffffd0;
  QFileInfoGatherer *in_stack_ffffffffffffffd8;
  
  if (in_ESI == 0) {
    _t1 = (QString *)(ulong)in_EDX;
    switch(_t1) {
    case (QString *)0x0:
      updates(in_stack_ffffffffffffffa0,_t1,(QList<std::pair<QString,_QFileInfo>_> *)0xa94f02);
      break;
    case (QString *)0x1:
      newListOfFiles(in_stack_ffffffffffffffa0,_t1,(QStringList *)0xa94f23);
      break;
    case (QString *)0x2:
      nameResolved(in_stack_ffffffffffffffa0,_t1,(QString *)0xa94f44);
      break;
    case (QString *)0x3:
      directoryLoaded(in_stack_ffffffffffffffa0,_t1);
      break;
    case (QString *)0x4:
      list(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      break;
    case (QString *)0x5:
      fetchExtendedInformation
                (in_stack_ffffffffffffffd8,(QString *)in_stack_ffffffffffffffd0,
                 in_stack_ffffffffffffffc8);
      break;
    case (QString *)0x6:
      updateFile(in_stack_ffffffffffffffd0,(QString *)in_stack_ffffffffffffffc8);
      break;
    case (QString *)0x7:
      setResolveSymlinks(in_RDI,(bool)(**(byte **)(in_RCX + 8) & 1));
      break;
    case (QString *)0x8:
      setIconProvider(in_RDI,(QAbstractFileIconProvider *)**(undefined8 **)(in_RCX + 8));
      break;
    case (QString *)0x9:
      driveAdded(in_stack_ffffffffffffffa8);
      break;
    case (QString *)0xa:
      driveRemoved(in_stack_ffffffffffffffc0);
    }
  }
  if ((((in_ESI == 5) &&
       (bVar1 = QtMocHelpers::
                indexOfMethod<void(QFileInfoGatherer::*)(QString_const&,QList<std::pair<QString,QFileInfo>>const&)>
                          (in_RCX,(void **)updates,0,0), !bVar1)) &&
      (bVar1 = QtMocHelpers::
               indexOfMethod<void(QFileInfoGatherer::*)(QString_const&,QList<QString>const&)const>
                         (in_RCX,(void **)newListOfFiles,0,1), !bVar1)) &&
     (bVar1 = QtMocHelpers::
              indexOfMethod<void(QFileInfoGatherer::*)(QString_const&,QString_const&)const>
                        (in_RCX,(void **)nameResolved,0,2), !bVar1)) {
    QtMocHelpers::indexOfMethod<void(QFileInfoGatherer::*)(QString_const&)>
              (in_RCX,(void **)directoryLoaded,0,3);
  }
  return;
}

Assistant:

void QFileInfoGatherer::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QFileInfoGatherer *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->updates((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QList<std::pair<QString,QFileInfo>>>>(_a[2]))); break;
        case 1: _t->newListOfFiles((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QStringList>>(_a[2]))); break;
        case 2: _t->nameResolved((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 3: _t->directoryLoaded((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 4: _t->list((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 5: _t->fetchExtendedInformation((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QStringList>>(_a[2]))); break;
        case 6: _t->updateFile((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 7: _t->setResolveSymlinks((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 8: _t->setIconProvider((*reinterpret_cast< std::add_pointer_t<QAbstractFileIconProvider*>>(_a[1]))); break;
        case 9: _t->driveAdded(); break;
        case 10: _t->driveRemoved(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QFileInfoGatherer::*)(const QString & , const QList<std::pair<QString,QFileInfo>> & )>(_a, &QFileInfoGatherer::updates, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFileInfoGatherer::*)(const QString & , const QStringList & ) const>(_a, &QFileInfoGatherer::newListOfFiles, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFileInfoGatherer::*)(const QString & , const QString & ) const>(_a, &QFileInfoGatherer::nameResolved, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFileInfoGatherer::*)(const QString & )>(_a, &QFileInfoGatherer::directoryLoaded, 3))
            return;
    }
}